

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::MergePartialFromImpl<true>
          (internal *this,BoundedZCIS input,MessageLite *msg)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  ParseContext ctx;
  EpsCopyInputStream local_88;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_88.zcis_ = (ZeroCopyInputStream *)0x0;
  local_88.buffer_[0] = '\0';
  local_88.buffer_[1] = '\0';
  local_88.buffer_[2] = '\0';
  local_88.buffer_[3] = '\0';
  local_88.buffer_[4] = '\0';
  local_88.buffer_[5] = '\0';
  local_88.buffer_[6] = '\0';
  local_88.buffer_[7] = '\0';
  local_88.buffer_[8] = '\0';
  local_88.buffer_[9] = '\0';
  local_88.buffer_[10] = '\0';
  local_88.buffer_[0xb] = '\0';
  local_88.buffer_[0xc] = '\0';
  local_88.buffer_[0xd] = '\0';
  local_88.buffer_[0xe] = '\0';
  local_88.buffer_[0xf] = '\0';
  local_88.buffer_[0x10] = '\0';
  local_88.buffer_[0x11] = '\0';
  local_88.buffer_[0x12] = '\0';
  local_88.buffer_[0x13] = '\0';
  local_88.buffer_[0x14] = '\0';
  local_88.buffer_[0x15] = '\0';
  local_88.buffer_[0x16] = '\0';
  local_88.buffer_[0x17] = '\0';
  local_88.buffer_[0x18] = '\0';
  local_88.buffer_[0x19] = '\0';
  local_88.buffer_[0x1a] = '\0';
  local_88.buffer_[0x1b] = '\0';
  local_88.buffer_[0x1c] = '\0';
  local_88.buffer_[0x1d] = '\0';
  local_88.buffer_[0x1e] = '\0';
  local_88.buffer_[0x1f] = '\0';
  local_88.aliasing_ = 1;
  local_88.last_tag_minus_1_ = 0;
  local_30 = io::CodedInputStream::default_recursion_limit_;
  local_2c = 0x80000000;
  local_28 = 0;
  uStack_20 = 0;
  local_88.overall_limit_ = (int)input.zcis;
  pcVar1 = EpsCopyInputStream::InitFrom(&local_88,(ZeroCopyInputStream *)this);
  local_88.limit_ = ((int)pcVar1 - (int)local_88.buffer_end_) + (int)input.zcis;
  local_88.limit_end_ =
       (char *)((long)(local_88.limit_ >> 0x1f & local_88.limit_) +
               CONCAT44(local_88.buffer_end_._4_4_,(int)local_88.buffer_end_));
  lVar2 = (**(code **)(*input._8_8_ + 0x68))(input._8_8_,pcVar1,&local_88);
  if (lVar2 == 0) {
    bVar4 = false;
  }
  else {
    if (local_88.next_chunk_ == local_88.buffer_) {
      uVar3 = ((int)local_88.buffer_end_ - (int)lVar2) + 0x10;
    }
    else {
      uVar3 = ((int)local_88.buffer_end_ - (int)lVar2) + local_88.size_;
    }
    if (0 < (int)uVar3) {
      (*(local_88.zcis_)->_vptr_ZeroCopyInputStream[3])(local_88.zcis_,(ulong)uVar3);
    }
    bVar4 = local_88.last_tag_minus_1_ == 0;
  }
  return bVar4;
}

Assistant:

bool MergePartialFromImpl(BoundedZCIS input, MessageLite* msg) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = msg->_InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  return ctx.EndedAtLimit();
}